

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sheet.hpp
# Opt level: O0

void __thiscall Excel::Sheet::initCell(Sheet *this,size_t row,size_t column)

{
  bool bVar1;
  undefined1 *puVar2;
  reference this_00;
  size_type sVar3;
  iterator __lhs;
  size_type in_RDX;
  vector<Excel::Cell,_std::allocator<Excel::Cell>_> *in_RSI;
  vector<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>
  *in_RDI;
  iterator last;
  iterator it;
  bool all;
  vector<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>
  *in_stack_ffffffffffffffd0;
  __normal_iterator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_*,_std::vector<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>_>
  local_28;
  undefined1 local_19;
  
  puVar2 = (undefined1 *)
           std::
           vector<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>
           ::size(in_RDI);
  if (puVar2 < (undefined1 *)
               ((long)&(in_RSI->super__Vector_base<Excel::Cell,_std::allocator<Excel::Cell>_>).
                       _M_impl.super__Vector_impl_data._M_start + 1U)) {
    std::
    vector<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>
    ::resize((vector<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>
              *)in_RSI,in_RDX);
  }
  this_00 = std::
            vector<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>
            ::operator[](in_RDI,(size_type)in_RSI);
  sVar3 = std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>::size(this_00);
  if (sVar3 < in_RDX + 1) {
    local_19 = in_RDI[5].
               super__Vector_base<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage < (pointer)(in_RDX + 1);
    if ((bool)local_19) {
      in_RDI[5].
      super__Vector_base<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(in_RDX + 1);
      local_28._M_current =
           (vector<Excel::Cell,_std::allocator<Excel::Cell>_> *)
           std::
           vector<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>
           ::begin(in_RDI);
      __lhs = std::
              vector<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>
              ::end(in_RDI);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_*,_std::vector<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>_>
                                 *)__lhs._M_current,
                                (__normal_iterator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_*,_std::vector<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>_>
                                 *)in_RDI), bVar1) {
        __gnu_cxx::
        __normal_iterator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_*,_std::vector<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>_>
        ::operator->(&local_28);
        std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>::resize(in_RSI,in_RDX);
        __gnu_cxx::
        __normal_iterator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_*,_std::vector<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>_>
        ::operator++(&local_28);
      }
    }
    else {
      std::
      vector<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>
      ::back(in_stack_ffffffffffffffd0);
      std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>::resize(in_RSI,in_RDX);
    }
  }
  return;
}

Assistant:

inline void
Sheet::initCell( size_t row, size_t column )
{
	if( m_cells.size() < row + 1 )
		m_cells.resize( row + 1 );

	if( m_cells[ row ].size() < column + 1 )
	{
		bool all = false;

		if( column + 1 > m_columnsCount )
		{
			m_columnsCount = column + 1;
			all = true;
		}

		if( all )
		{
			for( std::vector< std::vector< Cell > >::iterator it = m_cells.begin(),
				last = m_cells.end(); it != last; ++it )
			{
				it->resize( m_columnsCount );
			}
		}
		else
			m_cells.back().resize( m_columnsCount );
	}
}